

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompletionProvider.cpp
# Opt level: O2

void addMagicCommentCompletions(CompletionList *completions,File *file,PrefixData *prefix)

{
  ostream *poVar1;
  char *file_00;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string local_38;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"command so far: ");
  poVar1 = std::operator<<(poVar1,(string *)&prefix->value);
  std::operator<<(poVar1,"\n");
  file_00 = "!root";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"!root",&local_99);
  getRootForFile_abi_cxx11_(&local_98,(File *)file_00);
  std::operator+(&local_78,"% !TEX root = ",&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,(char *)"",&local_9a);
  CompletionList::addSnippet(completions,&local_58,&local_78,&prefix->range,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"!engine",(allocator<char> *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"% !TEX engine = ${0:pdflatex}",&local_99);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,(char *)"",&local_9a);
  CompletionList::addSnippet(completions,&local_58,&local_78,&prefix->range,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  poVar1 = std::operator<<((ostream *)&std::cerr,"R:");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void addMagicCommentCompletions (CompletionList &completions, File &file, PrefixData &prefix) {
    std::cerr << "command so far: " << prefix.value << "\n";

    completions.addSnippet("!root", "% !TEX root = " + getRootForFile(file), prefix.range);
    completions.addSnippet("!engine", "% !TEX engine = ${0:pdflatex}", prefix.range);

    std::cerr << "R:" << prefix.range.start.column << ":" << prefix.range.end.column << "\n";
}